

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolutiondepthwise1d.cpp
# Opt level: O1

int ncnn::convolutiondepthwise1d
              (Mat *bottom_blob,Mat *top_blob,Mat *weight_data,Mat *bias_data,int kernel_w,
              int stride_w,int dilation_w,int group,int activation_type,Mat *activation_params,
              Option *opt)

{
  int iVar1;
  void *pvVar2;
  void *pvVar3;
  size_t sVar4;
  float *pfVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  uint uVar8;
  int iVar9;
  float *pfVar10;
  ulong uVar11;
  void *pvVar12;
  long lVar13;
  float *pfVar14;
  long lVar15;
  ulong uVar16;
  float *pfVar17;
  ulong uVar18;
  ulong uVar19;
  void *pvVar20;
  long lVar21;
  long lVar22;
  bool bVar23;
  float fVar24;
  undefined1 extraout_var [12];
  undefined1 auVar25 [16];
  float fVar26;
  float fVar27;
  float fVar28;
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  int local_114;
  float *local_110;
  ulong local_f0;
  ulong local_c8;
  void *local_a8;
  undefined8 uStack_a0;
  
  uVar8 = bottom_blob->h;
  uVar16 = (ulong)uVar8;
  iVar1 = top_blob->w;
  lVar13 = (long)iVar1;
  pvVar2 = bias_data->data;
  if (pvVar2 == (void *)0x0) {
    bVar23 = true;
  }
  else {
    bVar23 = (long)bias_data->c * bias_data->cstep == 0;
  }
  if (top_blob->h == group && uVar8 == group) {
    if (0 < group) {
      pvVar3 = top_blob->data;
      sVar4 = top_blob->elemsize;
      pvVar20 = weight_data->data;
      local_110 = (float *)bottom_blob->data;
      uVar16 = (long)bottom_blob->w * bottom_blob->elemsize;
      uVar19 = 0;
      do {
        if (0 < iVar1) {
          pfVar5 = (float *)activation_params->data;
          lVar22 = 0;
          pfVar14 = local_110;
          do {
            uVar11 = 0;
            if (!bVar23) {
              uVar11 = (ulong)*(uint *)((long)pvVar2 + uVar19 * 4);
            }
            auVar29._8_8_ = 0;
            auVar29._0_8_ = uVar11;
            if (0 < kernel_w) {
              uVar11 = 0;
              pfVar10 = pfVar14;
              do {
                auVar29._0_4_ = auVar29._0_4_ + *(float *)((long)pvVar20 + uVar11 * 4) * *pfVar10;
                uVar11 = uVar11 + 1;
                pfVar10 = pfVar10 + dilation_w;
              } while ((uint)kernel_w != uVar11);
            }
            fVar24 = auVar29._0_4_;
            switch(activation_type) {
            case 1:
              if (fVar24 <= 0.0) {
                auVar6._12_4_ = 0;
                auVar6._0_12_ = auVar29._4_12_;
                auVar29 = auVar6 << 0x20;
              }
            default:
switchD_00532df9_default:
              fVar26 = auVar29._0_4_;
              break;
            case 2:
              fVar26 = (float)(~-(uint)(0.0 < fVar24) & (uint)*pfVar5 |
                              -(uint)(0.0 < fVar24) & 0x3f800000) * fVar24;
              break;
            case 3:
              if (fVar24 <= *pfVar5) {
                auVar29._0_4_ = *pfVar5;
              }
              fVar26 = pfVar5[1];
              if (auVar29._0_4_ <= fVar26) {
                fVar26 = auVar29._0_4_;
              }
              break;
            case 4:
              if (88.37626 <= fVar24) {
                fVar24 = 88.37626;
              }
              fVar24 = expf((float)(-(uint)(fVar24 < -88.37626) & 0x42b0c0a5 |
                                   ~-(uint)(fVar24 < -88.37626) & (uint)-fVar24));
              fVar26 = 1.0 / (fVar24 + 1.0);
              break;
            case 5:
              fVar26 = expf(fVar24);
              fVar26 = logf(fVar26 + 1.0);
              fVar26 = tanhf(fVar26);
              fVar26 = fVar26 * fVar24;
              break;
            case 6:
              fVar28 = *pfVar5;
              fVar27 = -pfVar5[1] / fVar28;
              fVar26 = 0.0;
              if (fVar27 <= fVar24) {
                if (fVar27 + 1.0 / fVar28 < fVar24) goto switchD_00532df9_default;
                fVar26 = (fVar28 * fVar24 + pfVar5[1]) * fVar24;
              }
            }
            *(float *)((long)pvVar3 + lVar22 * 4 + sVar4 * lVar13 * uVar19) = fVar26;
            lVar22 = lVar22 + 1;
            pfVar14 = pfVar14 + stride_w;
          } while (lVar22 != lVar13);
        }
        uVar19 = uVar19 + 1;
        pvVar20 = (void *)((long)pvVar20 + (long)kernel_w * 4);
        local_110 = (float *)((long)local_110 + uVar16);
      } while (uVar19 != (uint)group);
    }
  }
  else {
    uVar8 = (int)uVar8 / group;
    uVar19 = (long)top_blob->h / (long)group;
    uVar16 = uVar19 & 0xffffffff;
    iVar9 = (int)uVar19;
    if (0 < group) {
      pvVar3 = top_blob->data;
      sVar4 = top_blob->elemsize;
      pvVar20 = weight_data->data;
      uVar16 = 0;
      local_114 = 0;
      local_c8 = 0;
      do {
        if (0 < iVar9) {
          local_a8 = (void *)((long)pvVar20 + (long)local_114 * 4);
          local_f0 = 0;
          do {
            if (0 < iVar1) {
              lVar22 = local_f0 + local_c8 * (long)iVar9;
              pfVar5 = (float *)activation_params->data;
              lVar21 = (long)bottom_blob->w * bottom_blob->elemsize;
              pfVar14 = (float *)(lVar21 * uVar16 + (long)bottom_blob->data);
              lVar15 = 0;
              do {
                uVar11 = 0;
                if (!bVar23) {
                  uVar11 = (ulong)*(uint *)((long)pvVar2 + lVar22 * 4);
                }
                auVar30._8_8_ = 0;
                auVar30._0_8_ = uVar11;
                if (0 < (int)uVar8) {
                  uVar11 = 0;
                  pfVar10 = pfVar14;
                  pvVar12 = local_a8;
                  do {
                    if (0 < kernel_w) {
                      uVar18 = 0;
                      pfVar17 = pfVar10;
                      do {
                        auVar30._0_4_ =
                             auVar30._0_4_ + *(float *)((long)pvVar12 + uVar18 * 4) * *pfVar17;
                        uVar18 = uVar18 + 1;
                        pfVar17 = pfVar17 + dilation_w;
                      } while ((uint)kernel_w != uVar18);
                    }
                    uVar11 = uVar11 + 1;
                    pvVar12 = (void *)((long)pvVar12 + (long)kernel_w * 4);
                    pfVar10 = (float *)((long)pfVar10 + lVar21);
                  } while (uVar11 != uVar8);
                }
                fVar24 = auVar30._0_4_;
                auVar25 = auVar30;
                switch(activation_type) {
                case 1:
                  if (fVar24 <= 0.0) {
                    auVar7._12_4_ = 0;
                    auVar7._0_12_ = auVar30._4_12_;
                    auVar25 = auVar7 << 0x20;
                  }
                  break;
                case 2:
                  auVar25 = ZEXT416((uint)((float)(~-(uint)(0.0 < fVar24) & (uint)*pfVar5 |
                                                  -(uint)(0.0 < fVar24) & 0x3f800000) * fVar24));
                  break;
                case 3:
                  if (fVar24 <= *pfVar5) {
                    auVar30._0_4_ = *pfVar5;
                  }
                  fVar24 = pfVar5[1];
                  auVar25 = auVar30;
                  if (fVar24 < auVar30._0_4_) {
LAB_005332f4:
                    auVar25 = ZEXT416((uint)fVar24);
                  }
                  break;
                case 4:
                  if (88.37626 <= fVar24) {
                    fVar24 = 88.37626;
                  }
                  fVar24 = expf((float)(-(uint)(fVar24 < -88.37626) & 0x42b0c0a5 |
                                       ~-(uint)(fVar24 < -88.37626) & (uint)-fVar24));
                  auVar25 = ZEXT416((uint)(1.0 / (fVar24 + 1.0)));
                  break;
                case 5:
                  fVar26 = expf(fVar24);
                  fVar26 = logf(fVar26 + 1.0);
                  fVar26 = tanhf(fVar26);
                  auVar25._0_4_ = fVar26 * fVar24;
                  auVar25._4_12_ = extraout_var;
                  break;
                case 6:
                  fVar26 = *pfVar5;
                  fVar28 = -pfVar5[1] / fVar26;
                  auVar25 = ZEXT816(0);
                  if ((fVar28 <= fVar24) && (auVar25 = auVar30, fVar24 <= fVar28 + 1.0 / fVar26)) {
                    fVar24 = (fVar26 * fVar24 + pfVar5[1]) * fVar24;
                    goto LAB_005332f4;
                  }
                }
                *(int *)((long)pvVar3 + lVar15 * 4 + sVar4 * lVar13 * lVar22) = auVar25._0_4_;
                lVar15 = lVar15 + 1;
                pfVar14 = pfVar14 + stride_w;
              } while (lVar15 != lVar13);
            }
            local_f0 = local_f0 + 1;
            local_a8 = (void *)((long)local_a8 + (long)(int)(uVar8 * kernel_w) * 4);
          } while (local_f0 != (uVar19 & 0xffffffff));
        }
        local_c8 = local_c8 + 1;
        local_114 = local_114 + uVar8 * kernel_w * iVar9;
        uVar16 = (ulong)((int)uVar16 + uVar8);
      } while (local_c8 != (uint)group);
    }
  }
  return (int)uVar16;
}

Assistant:

static int convolutiondepthwise1d(const Mat& bottom_blob, Mat& top_blob, const Mat& weight_data, const Mat& bias_data, int kernel_w, int stride_w, int dilation_w, int group, int activation_type, const Mat& activation_params, const Option& opt)
{
    const int h = bottom_blob.h;

    const int outw = top_blob.w;
    const int outh = top_blob.h;

    const int bias_term = bias_data.empty() ? 0 : 1;

    // depth-wise
    if (h == group && group == outh)
    {
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int g = 0; g < group; g++)
        {
            float* outptr = top_blob.row(g);
            const float* kptr = (const float*)weight_data + kernel_w * g;

            for (int j = 0; j < outw; j++)
            {
                float sum = 0.f;

                if (bias_term)
                    sum = bias_data[g];

                const float* sptr = bottom_blob.row(g) + j * stride_w;

                for (int k = 0; k < kernel_w; k++)
                {
                    float val = *sptr;
                    float w = kptr[k];
                    sum += val * w;

                    sptr += dilation_w;
                }

                outptr[j] = activation_ss(sum, activation_type, activation_params);
            }
        }
    }
    else
    {
        // group convolution
        const int h_g = h / group;
        const int outh_g = outh / group;

#ifdef _WIN32
        #pragma omp parallel for num_threads(opt.num_threads)
#else
        #pragma omp parallel for collapse(2) num_threads(opt.num_threads)
#endif
        for (int g = 0; g < group; g++)
        {
            for (int p = 0; p < outh_g; p++)
            {
                float* outptr = top_blob.row(g * outh_g + p);
                const float* weight_data_ptr = (const float*)weight_data + kernel_w * h_g * outh_g * g;

                for (int j = 0; j < outw; j++)
                {
                    float sum = 0.f;

                    if (bias_term)
                        sum = bias_data[outh_g * g + p];

                    const float* kptr = weight_data_ptr + kernel_w * h_g * p;

                    for (int q = 0; q < h_g; q++)
                    {
                        const float* sptr = bottom_blob.row(h_g * g + q) + j * stride_w;

                        for (int k = 0; k < kernel_w; k++)
                        {
                            float val = *sptr;
                            float w = kptr[k];
                            sum += val * w;

                            sptr += dilation_w;
                        }

                        kptr += kernel_w;
                    }

                    outptr[j] = activation_ss(sum, activation_type, activation_params);
                }
            }
        }
    }

    return 0;
}